

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::load_parrec(CImgList<unsigned_char> *this,char *filename)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint *puVar4;
  float *pfVar5;
  CImgList<unsigned_char> *pCVar6;
  int y;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  CImgIOException *pCVar10;
  CImgArgumentException *this_00;
  int x;
  int iVar11;
  uint **ppuVar12;
  uint size_y;
  int l;
  int iVar13;
  long lVar14;
  ulong uVar15;
  CImg<unsigned_char> *pCVar16;
  uint size_x;
  long lVar17;
  uint sn;
  float local_dcc;
  uint sizey;
  uint sizex;
  CImgList<unsigned_char> *local_dc0;
  FILE *local_db8;
  FILE *local_db0;
  CImg<unsigned_char> buf;
  CImgList<unsigned_int> st_global;
  CImgList<float> st_slices;
  float local_d68;
  float local_d64;
  float local_d60;
  float local_d5c;
  float local_d58;
  uint pixsize;
  char *local_d50;
  float ss;
  float ri;
  float rs;
  char line [256];
  char filenamerec [1024];
  char filenamepar [1024];
  char body [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Specified filename is (null).",
               (ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  memset(body,0,0x400);
  memset(filenamepar,0,0x400);
  memset(filenamerec,0,0x400);
  pcVar8 = cimg::split_filename(filename,body);
  iVar7 = strcmp(pcVar8,"par");
  if (iVar7 == 0) {
    strncpy(filenamepar,filename,0x3ff);
    snprintf(filenamerec,0x400,"%s.rec",body);
  }
  iVar7 = strcmp(pcVar8,"PAR");
  if (iVar7 == 0) {
    strncpy(filenamepar,filename,0x3ff);
    snprintf(filenamerec,0x400,"%s.REC",body);
  }
  iVar7 = strcmp(pcVar8,"rec");
  if (iVar7 == 0) {
    strncpy(filenamerec,filename,0x3ff);
    snprintf(filenamepar,0x400,"%s.par",body);
  }
  iVar7 = strcmp(pcVar8,"REC");
  if (iVar7 == 0) {
    strncpy(filenamerec,filename,0x3ff);
    snprintf(filenamepar,0x400,"%s.PAR",body);
  }
  local_db0 = cimg::fopen(filenamepar,"r");
  st_slices._width = 0;
  st_slices._allocated_width = 0;
  st_slices._data = (CImg<float> *)0x0;
  st_global._width = 0;
  st_global._allocated_width = 0;
  st_global._data = (CImg<unsigned_int> *)0x0;
  memset(line,0,0x100);
  do {
    iVar7 = __isoc99_fscanf(local_db0,"%255[^\n]%*c",line);
    if (iVar7 == -1) break;
  } while ((line[0] == '#') || (line[0] == '.'));
  local_dc0 = this;
  local_d50 = filename;
  do {
    iVar7 = __isoc99_fscanf(local_db0,"%u%*u%*u%*u%*u%*u%*u%u%*u%u%u%g%g%g%*[^\n]",&sn,&pixsize,
                            &sizex,&sizey,&ri,&rs,&ss);
    if (iVar7 != 7) {
      local_db8 = cimg::fopen(filenamerec,"rb");
      lVar17 = 0x18;
      for (lVar14 = 0; lVar14 < (int)st_global._width; lVar14 = lVar14 + 1) {
        puVar4 = *(uint **)((long)&(st_global._data)->_width + lVar17);
        CImg<unsigned_char>::CImg(&buf,*puVar4,puVar4[1],puVar4[2],1);
        CImg<unsigned_char>::move_to<unsigned_char>(&buf,local_dc0,0xffffffff);
        CImg<unsigned_char>::~CImg(&buf);
        lVar17 = lVar17 + 0x20;
      }
      lVar17 = 0;
      do {
        if ((int)st_slices._width <= lVar17) {
          cimg::fclose(local_db0);
          cimg::fclose(local_db8);
          pCVar6 = local_dc0;
          if (local_dc0->_width == 0) {
            pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x4008);
            CImgIOException::CImgIOException
                      (pCVar10,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Failed to recognize valid PAR-REC data in file \'%s\'."
                       ,(ulong)pCVar6->_width,(ulong)pCVar6->_allocated_width,pCVar6->_data,
                       "unsigned char",local_d50);
            __cxa_throw(pCVar10,&CImgIOException::typeinfo,std::exception::~exception,0x138d70);
          }
          CImgList<unsigned_int>::~CImgList(&st_global);
          CImgList<float>::~CImgList(&st_slices);
          return pCVar6;
        }
        pfVar5 = st_slices._data[lVar17]._data;
        fVar1 = pfVar5[1];
        iVar13 = (int)(long)*pfVar5 + -1;
        local_dcc = pfVar5[4];
        fVar2 = pfVar5[5];
        fVar3 = pfVar5[6];
        uVar9 = (long)pfVar5[7] & 0xffffffff;
        iVar7 = (int)(long)fVar1;
        size_x = (uint)(long)pfVar5[2];
        size_y = (uint)(long)pfVar5[3];
        if (iVar7 == 0x20) {
          CImg<unsigned_int>::CImg((CImg<unsigned_int> *)&buf,size_x,size_y,1,1);
          cimg::fread<unsigned_int>((uint *)buf._data,size_y * size_x,(FILE *)local_db8);
          pCVar16 = local_dc0->_data + uVar9;
          for (iVar7 = 0; iVar7 < (int)pCVar16->_height; iVar7 = iVar7 + 1) {
            for (iVar11 = 0; iVar11 < (int)pCVar16->_width; iVar11 = iVar11 + 1) {
              pCVar16->_data[pCVar16->_width * (pCVar16->_height * iVar13 + iVar7) + iVar11] =
                   (uchar)(int)(((float)*(uint *)(buf._data +
                                                 (ulong)(buf._width * iVar7 + iVar11) * 4) * fVar2 +
                                local_dcc) / (fVar3 * fVar2));
            }
          }
          CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&buf);
        }
        else if (iVar7 == 0x10) {
          CImg<unsigned_short>::CImg((CImg<unsigned_short> *)&buf,size_x,size_y,1,1);
          cimg::fread<unsigned_short>((unsigned_short *)buf._data,size_y * size_x,(FILE *)local_db8)
          ;
          pCVar16 = local_dc0->_data + uVar9;
          for (iVar7 = 0; iVar7 < (int)pCVar16->_height; iVar7 = iVar7 + 1) {
            for (iVar11 = 0; iVar11 < (int)pCVar16->_width; iVar11 = iVar11 + 1) {
              pCVar16->_data[pCVar16->_width * (pCVar16->_height * iVar13 + iVar7) + iVar11] =
                   (uchar)(int)(((float)*(ushort *)
                                         (buf._data + (ulong)(buf._width * iVar7 + iVar11) * 2) *
                                 fVar2 + local_dcc) / (fVar3 * fVar2));
            }
          }
          CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&buf);
        }
        else {
          if (iVar7 != 8) {
            cimg::fclose(local_db0);
            cimg::fclose(local_db8);
            pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x4008);
            pcVar8 = local_d50;
            CImgIOException::CImgIOException
                      (pCVar10,
                       "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Unsupported %d-bits pixel type for file \'%s\'."
                       ,(ulong)local_dc0->_width,(ulong)local_dc0->_allocated_width,local_dc0->_data
                       ,"unsigned char",(long)fVar1);
            __cxa_throw(pCVar10,&CImgIOException::typeinfo,std::exception::~exception,pcVar8);
          }
          CImg<unsigned_char>::CImg(&buf,size_x,size_y,1,1);
          cimg::fread<unsigned_char>(buf._data,size_y * size_x,(FILE *)local_db8);
          pCVar16 = local_dc0->_data + uVar9;
          for (iVar7 = 0; iVar7 < (int)pCVar16->_height; iVar7 = iVar7 + 1) {
            for (iVar11 = 0; iVar11 < (int)pCVar16->_width; iVar11 = iVar11 + 1) {
              pCVar16->_data[pCVar16->_width * (pCVar16->_height * iVar13 + iVar7) + iVar11] =
                   (uchar)(int)(((float)buf._data[buf._width * iVar7 + iVar11] * fVar2 + local_dcc)
                               / (fVar3 * fVar2));
            }
          }
          CImg<unsigned_char>::~CImg(&buf);
        }
        lVar17 = lVar17 + 1;
      } while( true );
    }
    local_d58 = (float)sn;
    local_d5c = (float)pixsize;
    local_d60 = (float)sizex;
    local_d64 = (float)sizey;
    local_d68 = 0.0;
    CImg<float>::vector((CImg<float> *)&buf,&local_d58,&local_d5c,&local_d60,&local_d64,&ri,&rs,&ss,
                        &local_d68);
    CImg<float>::move_to<float>((CImg<float> *)&buf,&st_slices,0xffffffff);
    CImg<float>::~CImg((CImg<float> *)&buf);
    uVar9 = st_global._0_8_ & 0xffffffff;
    ppuVar12 = &(st_global._data)->_data;
    for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
      if ((*ppuVar12)[2] < sn) {
        uVar9 = uVar15;
        if (st_global._width != (uint)uVar15) {
          puVar4 = *ppuVar12;
          if (*puVar4 < sizex) {
            *puVar4 = sizex;
          }
          if (puVar4[1] < sizey) {
            puVar4[1] = sizey;
          }
          puVar4[2] = sn;
          goto LAB_00138927;
        }
        break;
      }
      ppuVar12 = ppuVar12 + 4;
    }
    CImg<unsigned_int>::vector((CImg<unsigned_int> *)&buf,&sizex,&sizey,&sn);
    CImg<unsigned_int>::move_to<unsigned_int>((CImg<unsigned_int> *)&buf,&st_global,0xffffffff);
    CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)&buf);
    uVar15 = uVar9;
LAB_00138927:
    st_slices._data[st_slices._width - 1]._data[7] = (float)(uVar15 & 0xffffffff);
  } while( true );
}

Assistant:

CImgList<T>& load_parrec(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimglist_instance
                                    "load_parrec() : Specified filename is (null).",
                                    cimglist_instance);

      char body[1024] = { 0 }, filenamepar[1024] = { 0 }, filenamerec[1024] = { 0 };
      const char *const ext = cimg::split_filename(filename,body);
      if (!std::strcmp(ext,"par")) { std::strncpy(filenamepar,filename,sizeof(filenamepar)-1); cimg_snprintf(filenamerec,sizeof(filenamerec),"%s.rec",body); }
      if (!std::strcmp(ext,"PAR")) { std::strncpy(filenamepar,filename,sizeof(filenamepar)-1); cimg_snprintf(filenamerec,sizeof(filenamerec),"%s.REC",body); }
      if (!std::strcmp(ext,"rec")) { std::strncpy(filenamerec,filename,sizeof(filenamerec)-1); cimg_snprintf(filenamepar,sizeof(filenamepar),"%s.par",body); }
      if (!std::strcmp(ext,"REC")) { std::strncpy(filenamerec,filename,sizeof(filenamerec)-1); cimg_snprintf(filenamepar,sizeof(filenamepar),"%s.PAR",body); }
      std::FILE *file = cimg::fopen(filenamepar,"r");

      // Parse header file
      CImgList<floatT> st_slices;
      CImgList<uintT> st_global;
      int err;
      char line[256] = { 0 };
      do { err=std::fscanf(file,"%255[^\n]%*c",line); } while (err!=EOF && (*line=='#' || *line=='.'));
      do {
        unsigned int sn,sizex,sizey,pixsize;
        float rs,ri,ss;
        err = std::fscanf(file,"%u%*u%*u%*u%*u%*u%*u%u%*u%u%u%g%g%g%*[^\n]",&sn,&pixsize,&sizex,&sizey,&ri,&rs,&ss);
        if (err==7) {
          CImg<floatT>::vector((float)sn,(float)pixsize,(float)sizex,(float)sizey,ri,rs,ss,0).move_to(st_slices);
          unsigned int i; for (i = 0; i<st_global._width && sn<=st_global[i][2]; ++i) {}
          if (i==st_global._width) CImg<uintT>::vector(sizex,sizey,sn).move_to(st_global);
          else {
            CImg<uintT> &vec = st_global[i];
            if (sizex>vec[0]) vec[0] = sizex;
            if (sizey>vec[1]) vec[1] = sizey;
            vec[2] = sn;
          }
          st_slices[st_slices._width-1][7] = (float)i;
        }
      } while (err==7);

      // Read data
      std::FILE *file2 = cimg::fopen(filenamerec,"rb");
      cimglist_for(st_global,l) {
        const CImg<uintT>& vec = st_global[l];
        CImg<T>(vec[0],vec[1],vec[2]).move_to(*this);
      }

      cimglist_for(st_slices,l) {
        const CImg<floatT>& vec = st_slices[l];
        const unsigned int
          sn = (unsigned int)vec[0] - 1,
          pixsize = (unsigned int)vec[1],
          sizex = (unsigned int)vec[2],
          sizey = (unsigned int)vec[3],
          imn = (unsigned int)vec[7];
        const float ri = vec[4], rs = vec[5], ss = vec[6];
        switch (pixsize) {
        case 8 : {
          CImg<ucharT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        case 16 : {
          CImg<ushortT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        case 32 : {
          CImg<uintT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        default :
          cimg::fclose(file);
          cimg::fclose(file2);
          throw CImgIOException(_cimglist_instance
                                "load_parrec() : Unsupported %d-bits pixel type for file '%s'.",
                                cimglist_instance,
                                pixsize,filename);
        }
      }
      cimg::fclose(file);
      cimg::fclose(file2);
      if (!_width)
        throw CImgIOException(_cimglist_instance
                              "load_parrec() : Failed to recognize valid PAR-REC data in file '%s'.",
                              cimglist_instance,
                              filename);
      return *this;
    }